

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_step(sqlite3_stmt *pStmt)

{
  char cVar1;
  undefined8 *puVar2;
  Btree *p_00;
  Wal *pWVar3;
  sqlite3 *psVar4;
  bool bVar5;
  long *plVar6;
  Vdbe *pVVar7;
  Vdbe *pVVar8;
  Vdbe *pVVar9;
  Vdbe *pFromStmt;
  long lVar10;
  int iVar11;
  uint uVar12;
  long *plVar13;
  undefined8 *puVar14;
  int *piVar15;
  char *pcVar16;
  ushort uVar17;
  char *z2_1;
  ulong uVar18;
  undefined8 uVar19;
  char *z2;
  long *plVar20;
  char *zFormat;
  char *pcVar21;
  byte *pbVar22;
  u32 uVar23;
  uint uVar24;
  Mem *pMem;
  int iVar25;
  int iVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  Vdbe *p;
  long lVar30;
  sqlite3_stmt *pNew;
  ulong local_1a0;
  Mem *local_198;
  Vdbe *local_190;
  int local_188;
  uint local_184;
  long local_180;
  char *local_178;
  sqlite3 *local_170;
  sqlite3_stmt *local_168;
  sqlite3_stmt *local_160;
  long local_158 [37];
  
  iVar11 = vdbeSafetyNotNull((Vdbe *)pStmt);
  if (iVar11 == 0) {
    local_170 = *(sqlite3 **)pStmt;
    if (local_170->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(local_170->mutex);
    }
    pStmt[0x8d] = (sqlite3_stmt)((byte)pStmt[0x8d] & 0xfd);
    local_168 = pStmt + 0xb8;
    local_160 = pStmt + 0x48;
    iVar11 = 0;
    uVar12 = 0;
LAB_001125c3:
    if (*(int *)(pStmt + 0x44) != -0x420df25d) {
      sqlite3_reset(pStmt);
    }
    puVar2 = *(undefined8 **)pStmt;
    if (*(char *)((long)puVar2 + 0x51) != '\0') {
      *(undefined4 *)(pStmt + 0x84) = 7;
      uVar24 = 7;
      goto LAB_00112a11;
    }
    local_184 = uVar12;
    if ((*(int *)(pStmt + 0x80) < 1) && (((byte)pStmt[0x8c] & 8) != 0)) {
      *(undefined4 *)(pStmt + 0x84) = 0x11;
      uVar24 = 1;
      goto LAB_001129e4;
    }
    if (*(int *)(pStmt + 0x80) < 0) {
      if (*(int *)((long)puVar2 + 0xa4) == 0) {
        *(undefined4 *)(puVar2 + 0x29) = 0;
      }
      if ((puVar2[0x1b] != 0) && (*(char *)((long)puVar2 + 0xa1) == '\0')) {
        sqlite3OsCurrentTimeInt64((sqlite3_vfs *)*puVar2,(sqlite3_int64 *)local_168);
      }
      *(int *)((long)puVar2 + 0xa4) = *(int *)((long)puVar2 + 0xa4) + 1;
      if (((byte)pStmt[0x8c] & 0x40) == 0) {
        *(int *)((long)puVar2 + 0xac) = *(int *)((long)puVar2 + 0xac) + 1;
      }
      if (((byte)pStmt[0x8c] & 0x80) != 0) {
        *(int *)(puVar2 + 0x15) = *(int *)(puVar2 + 0x15) + 1;
      }
      *(undefined4 *)(pStmt + 0x80) = 0;
    }
    local_188 = iVar11;
    if (((byte)pStmt[0x8c] & 3) == 0) {
      *(int *)(puVar2 + 0x16) = *(int *)(puVar2 + 0x16) + 1;
      uVar24 = sqlite3VdbeExec((Vdbe *)pStmt);
      *(int *)(puVar2 + 0x16) = *(int *)(puVar2 + 0x16) + -1;
      goto LAB_0011283b;
    }
    psVar4 = *(sqlite3 **)pStmt;
    lVar29 = *(long *)(pStmt + 0x10);
    local_198 = (Mem *)(lVar29 + 0x38);
    releaseMemArray(local_198,8);
    *(undefined8 *)(pStmt + 0x28) = 0;
    if (*(int *)(pStmt + 0x84) == 7) {
      psVar4->mallocFailed = '\x01';
      uVar24 = 1;
      goto LAB_0011283b;
    }
    iVar11 = *(int *)(pStmt + 0x3c);
    uVar17 = *(ushort *)(pStmt + 0x8c) & 3;
    iVar25 = iVar11;
    if (uVar17 == 1) {
      lVar30 = *(long *)(pStmt + 0x10);
      if ((*(byte *)(lVar30 + 0x200) & 0x10) == 0) {
        plVar13 = (long *)0x0;
        local_1a0 = 0;
      }
      else {
        local_1a0 = (ulong)(uint)(*(int *)(lVar30 + 0x204) >> 3);
        plVar13 = *(long **)(lVar30 + 0x208);
      }
      pMem = (Mem *)(lVar30 + 0x1f8);
      if (0 < (int)local_1a0) {
        uVar27 = 0;
        do {
          iVar25 = iVar25 + *(int *)(plVar13[uVar27] + 8);
          uVar27 = uVar27 + 1;
        } while (local_1a0 != uVar27);
      }
    }
    else {
      plVar13 = (long *)0x0;
      pMem = (Mem *)0x0;
      local_1a0 = 0;
    }
    uVar27 = (ulong)*(int *)(pStmt + 0x80);
    lVar30 = uVar27 * 0x18;
    lVar10 = uVar27 << 0x20;
    do {
      lVar28 = lVar10;
      uVar18 = uVar27;
      if ((uVar17 != 2) || ((long)iVar25 <= (long)uVar18)) break;
      pcVar16 = (char *)(*(long *)(pStmt + 8) + lVar30);
      lVar30 = lVar30 + 0x18;
      uVar27 = uVar18 + 1;
      lVar10 = lVar28 + 0x100000000;
    } while (*pcVar16 != -99);
    iVar26 = (int)uVar18;
    *(int *)(pStmt + 0x80) = iVar26 + 1;
    if ((long)iVar25 <= (long)uVar18) {
      *(undefined4 *)(pStmt + 0x84) = 0;
      uVar24 = 0x65;
      goto LAB_0011283b;
    }
    if ((psVar4->u1).isInterrupted != 0) {
      *(undefined4 *)(pStmt + 0x84) = 9;
      sqlite3SetString((char **)local_160,psVar4,"%s");
      uVar24 = 1;
      goto LAB_0011283b;
    }
    if (iVar26 < iVar11) {
      pbVar22 = (byte *)((lVar28 >> 0x20) * 0x18 + *(long *)(pStmt + 8));
    }
    else {
      uVar18 = (ulong)(uint)(iVar26 - iVar11);
      plVar20 = (long *)*plVar13;
      iVar25 = (int)plVar20[1];
      plVar6 = plVar13;
      if (iVar25 <= iVar26 - iVar11) {
        do {
          uVar12 = (int)uVar18 - iVar25;
          uVar18 = (ulong)uVar12;
          plVar20 = (long *)plVar6[1];
          iVar25 = (int)plVar20[1];
          plVar6 = plVar6 + 1;
        } while (iVar25 <= (int)uVar12);
      }
      pbVar22 = (byte *)((long)(int)uVar18 * 0x18 + *plVar20);
    }
    if (uVar17 == 1) {
      *(undefined2 *)(lVar29 + 0x40) = 4;
      *(long *)(lVar29 + 0x38) = (long)(int)uVar18;
      *(undefined2 *)(lVar29 + 0x78) = 0xa02;
      pcVar16 = *(char **)(sqlite3OpcodeName_azName + (ulong)*pbVar22 * 8);
      *(char **)(lVar29 + 0x80) = pcVar16;
      uVar12 = 0xffffffff;
      do {
        uVar12 = uVar12 + 1;
        cVar1 = *pcVar16;
        pcVar16 = pcVar16 + 1;
      } while (cVar1 != '\0');
      *(uint *)(lVar29 + 0x7c) = uVar12 & 0x3fffffff;
      *(undefined1 *)(lVar29 + 0x7a) = 1;
      local_198 = (Mem *)(lVar29 + 0xa8);
      if (pbVar22[1] == 0xee) {
        iVar11 = (int)local_1a0;
        if (iVar11 < 1) {
          uVar27 = 0;
        }
        else {
          uVar18 = 0;
          do {
            uVar27 = uVar18;
            if (plVar13[uVar18] == *(long *)(pbVar22 + 0x10)) break;
            uVar18 = uVar18 + 1;
            uVar27 = local_1a0;
          } while (local_1a0 != uVar18);
        }
        if ((int)uVar27 == iVar11) {
          iVar26 = iVar11 * 8 + 8;
          iVar25 = sqlite3VdbeMemGrow(pMem,iVar26,(uint)(iVar11 != 0));
          if (iVar25 == 0) {
            *(undefined8 *)(pMem->z + (long)iVar11 * 8) = *(undefined8 *)(pbVar22 + 0x10);
            *(byte *)&pMem->flags = (byte)pMem->flags | 0x10;
            pMem->n = iVar26;
          }
        }
      }
    }
    local_198->flags = 4;
    local_198->u = (MemValue)(long)*(int *)(pbVar22 + 4);
    local_198[1].flags = 4;
    local_198[1].u = (MemValue)(long)*(int *)(pbVar22 + 8);
    local_198[2].flags = 4;
    local_198[2].u = (MemValue)(long)*(int *)(pbVar22 + 0xc);
    if (local_198[3].szMalloc < 0x20) {
      iVar11 = sqlite3VdbeMemGrow(local_198 + 3,0x20,0);
      uVar24 = 1;
      if (iVar11 != 0) goto LAB_0011283b;
    }
    else {
      local_198[3].z = local_198[3].zMalloc;
      local_198[3].flags = local_198[3].flags & 0xd;
    }
    local_198[3].flags = 0x202;
    pcVar16 = local_198[3].z;
    pcVar21 = pcVar16;
    switch(pbVar22[1]) {
    case 0xed:
switchD_00112d38_caseD_ed:
      *pcVar16 = '\0';
      pcVar21 = pcVar16;
      break;
    case 0xee:
      pcVar21 = "program";
      goto LAB_00112dd7;
    default:
      pcVar21 = *(char **)(pbVar22 + 0x10);
      if (*(char **)(pbVar22 + 0x10) == (char *)0x0) goto switchD_00112d38_caseD_ed;
      break;
    case 0xf1:
      pcVar21 = "intarray";
LAB_00112dd7:
      sqlite3_snprintf(0x20,pcVar16,pcVar21);
      pcVar21 = pcVar16;
      break;
    case 0xf2:
      sqlite3_snprintf(0x20,pcVar16,"%d",(ulong)*(uint *)(pbVar22 + 0x10));
      break;
    case 0xf3:
      puVar14 = *(undefined8 **)(pbVar22 + 0x10);
LAB_00112d6d:
      uVar19 = *puVar14;
      zFormat = "%lld";
      goto LAB_00112dfd;
    case 0xf4:
      puVar14 = *(undefined8 **)(pbVar22 + 0x10);
LAB_00112d85:
      sqlite3_snprintf(0x20,pcVar16,"%.16g",(int)*puVar14);
      break;
    case 0xf6:
      uVar19 = *(undefined8 *)(*(long *)(pbVar22 + 0x10) + 0x10);
      zFormat = "vtab:%p";
      goto LAB_00112dfd;
    case 0xf8:
      puVar14 = *(undefined8 **)(pbVar22 + 0x10);
      uVar17 = *(ushort *)(puVar14 + 1);
      if ((uVar17 & 2) == 0) {
        if ((uVar17 & 4) != 0) goto LAB_00112d6d;
        if ((uVar17 & 8) != 0) goto LAB_00112d85;
        pcVar21 = "(blob)";
        if ((uVar17 & 1) != 0) {
          pcVar21 = "NULL";
          goto LAB_00112dd7;
        }
      }
      else {
        pcVar21 = (char *)puVar14[2];
      }
      break;
    case 0xfa:
      local_180 = *(long *)(pbVar22 + 0x10);
      uVar12 = 0;
      local_178 = pcVar16;
      sqlite3_snprintf(0x20,pcVar16,"k(%d",(ulong)*(ushort *)(local_180 + 6));
      if (local_178 != (char *)0x0) {
        uVar12 = 0xffffffff;
        pcVar16 = local_178;
        do {
          uVar12 = uVar12 + 1;
          cVar1 = *pcVar16;
          pcVar16 = pcVar16 + 1;
        } while (cVar1 != '\0');
        uVar12 = uVar12 & 0x3fffffff;
      }
      pcVar21 = local_178;
      if (*(short *)(local_180 + 6) != 0) {
        uVar27 = 0;
        lVar29 = local_180;
        do {
          puVar14 = *(undefined8 **)(lVar29 + 0x20 + uVar27 * 8);
          pcVar16 = "nil";
          if (puVar14 != (undefined8 *)0x0) {
            pcVar16 = (char *)*puVar14;
          }
          if ((int *)pcVar16 == (int *)0x0) {
            uVar24 = 0;
          }
          else {
            uVar24 = 0xffffffff;
            piVar15 = (int *)pcVar16;
            do {
              uVar24 = uVar24 + 1;
              iVar11 = *piVar15;
              piVar15 = (int *)((long)piVar15 + 1);
            } while ((char)iVar11 != '\0');
            uVar24 = uVar24 & 0x3fffffff;
          }
          if ((uVar24 == 6) &&
             (bVar5 = (short)*(int *)((long)pcVar16 + 4) != 0x5952,
             uVar24 = (uint)(bVar5 || *(int *)pcVar16 != 0x414e4942) * 5 + 1,
             !bVar5 && *(int *)pcVar16 == 0x414e4942)) {
            pcVar16 = "B";
          }
          iVar11 = uVar24 + uVar12;
          uVar18 = (ulong)uVar12;
          if (iVar11 < 0x1b) {
            pcVar21[uVar18] = ',';
            if (*(char *)(*(long *)(lVar29 + 0x18) + uVar27) == '\0') {
              uVar12 = (uint)(uVar18 + 1);
            }
            else {
              uVar12 = uVar12 + 2;
              pcVar21[uVar18 + 1] = '-';
            }
            memcpy(pcVar21 + uVar12,pcVar16,(ulong)(uVar24 + 1));
            uVar12 = uVar12 + uVar24;
            lVar29 = local_180;
            pcVar21 = local_178;
          }
          else {
            builtin_strncpy(pcVar21 + uVar18,",...",4);
          }
        } while ((iVar11 < 0x1b) && (uVar27 = uVar27 + 1, uVar27 < *(ushort *)(lVar29 + 6)));
      }
      (pcVar21 + uVar12)[0] = ')';
      (pcVar21 + uVar12)[1] = '\0';
      break;
    case 0xfb:
      sqlite3_snprintf(0x20,pcVar16,"%s(%d)",*(undefined8 *)(*(long *)(pbVar22 + 0x10) + 0x30));
      break;
    case 0xfc:
      uVar19 = **(undefined8 **)(pbVar22 + 0x10);
      zFormat = "(%.20s)";
LAB_00112dfd:
      sqlite3_snprintf(0x20,pcVar16,zFormat,uVar19);
    }
    pcVar16 = local_198[3].z;
    if (pcVar21 == pcVar16) {
      if (pcVar16 == (char *)0x0) {
        uVar12 = 0;
      }
      else {
        uVar12 = 0xffffffff;
        do {
          uVar12 = uVar12 + 1;
          cVar1 = *pcVar16;
          pcVar16 = pcVar16 + 1;
        } while (cVar1 != '\0');
        uVar12 = uVar12 & 0x3fffffff;
      }
      local_198[3].n = uVar12;
      local_198[3].enc = '\x01';
    }
    else {
      sqlite3VdbeMemSetStr(local_198 + 3,pcVar21,-1,'\x01',(_func_void_void_ptr *)0x0);
    }
    if ((*(ushort *)(pStmt + 0x8c) & 3) == 1) {
      if (3 < local_198[4].szMalloc) {
        local_198[4].z = local_198[4].zMalloc;
        local_198[4].flags = local_198[4].flags & 0xd;
LAB_00112f2f:
        local_198[4].flags = 0x202;
        local_198[4].n = 2;
        sqlite3_snprintf(3,local_198[4].z,"%.2x");
        local_198[4].enc = '\x01';
        local_198[5].flags = 1;
        goto LAB_00112f79;
      }
      iVar11 = sqlite3VdbeMemGrow(local_198 + 4,4,0);
      uVar24 = 1;
      if (iVar11 == 0) goto LAB_00112f2f;
    }
    else {
LAB_00112f79:
      *(ushort *)(pStmt + 0x88) = (ushort)(~*(uint *)(pStmt + 0x8c) << 2) & 0xc;
      *(long *)(pStmt + 0x28) = *(long *)(pStmt + 0x10) + 0x38;
      *(undefined4 *)(pStmt + 0x84) = 0;
      uVar24 = 100;
    }
LAB_0011283b:
    if (uVar24 != 100) {
      if (((puVar2[0x1b] != 0) && (*(char *)((long)puVar2 + 0xa1) == '\0')) &&
         (*(long *)(pStmt + 0xe0) != 0)) {
        sqlite3OsCurrentTimeInt64((sqlite3_vfs *)*puVar2,local_158);
        (*(code *)puVar2[0x1b])
                  (puVar2[0x1c],*(undefined8 *)(pStmt + 0xe0),
                   (local_158[0] - *(long *)(pStmt + 0xb8)) * 1000000);
      }
      if (uVar24 == 0x65) {
        if (*(int *)(puVar2 + 5) < 1) {
          iVar11 = 0;
        }
        else {
          lVar30 = 0;
          lVar29 = 0;
          iVar11 = 0;
          do {
            p_00 = *(Btree **)(puVar2[4] + 8 + lVar30);
            if (p_00 != (Btree *)0x0) {
              if ((p_00->sharable != '\0') &&
                 (p_00->wantToLock = p_00->wantToLock + 1, p_00->locked == '\0')) {
                btreeLockCarefully(p_00);
              }
              pWVar3 = p_00->pBt->pPager->pWal;
              if (pWVar3 == (Wal *)0x0) {
                uVar23 = 0;
              }
              else {
                uVar23 = pWVar3->iCallback;
                pWVar3->iCallback = 0;
              }
              if (p_00->sharable != '\0') {
                piVar15 = &p_00->wantToLock;
                *piVar15 = *piVar15 + -1;
                if (*piVar15 == 0) {
                  unlockBtreeMutex(p_00);
                }
              }
              if ((((code *)puVar2[0x23] != (code *)0x0) && (0 < (int)uVar23)) && (iVar11 == 0)) {
                iVar11 = (*(code *)puVar2[0x23])
                                   (puVar2[0x24],puVar2,*(undefined8 *)(puVar2[4] + lVar30));
              }
            }
            lVar29 = lVar29 + 1;
            lVar30 = lVar30 + 0x20;
          } while (lVar29 < *(int *)(puVar2 + 5));
        }
        *(int *)(pStmt + 0x84) = iVar11;
        uVar24 = 1;
        if (iVar11 == 0) {
          uVar24 = 0x65;
        }
      }
    }
    iVar11 = local_188;
    *(uint *)((long)puVar2 + 0x44) = uVar24;
    psVar4 = *(sqlite3 **)pStmt;
    uVar12 = *(uint *)(pStmt + 0x84);
    if (psVar4 == (sqlite3 *)0x0) {
      uVar12 = uVar12 & 0xff;
    }
    else if ((uVar12 == 0xc0a) || (psVar4->mallocFailed != '\0')) {
      apiOomError(psVar4);
      uVar12 = 7;
    }
    else {
      uVar12 = uVar12 & psVar4->errMask;
    }
    if (uVar12 == 7) {
      *(undefined4 *)(pStmt + 0x84) = 7;
    }
LAB_001129e4:
    if ((uVar24 - 0x66 < 0xfffffffe) && ((*(ushort *)(pStmt + 0x8c) & 0x100) != 0)) {
      uVar24 = sqlite3VdbeTransferError((Vdbe *)pStmt);
    }
    uVar24 = uVar24 & *(uint *)(puVar2 + 9);
    uVar12 = local_184;
LAB_00112a11:
    if (uVar24 != 0x11) goto LAB_0011313a;
    if (iVar11 != 0x32) {
      if ((pStmt == (sqlite3_stmt *)0x0) || (((byte)pStmt[0x8d] & 1) == 0)) {
        pcVar16 = (char *)0x0;
      }
      else {
        pcVar16 = *(char **)(pStmt + 0xe0);
      }
      iVar25 = *(int *)(pStmt + 0x80);
      psVar4 = *(sqlite3 **)pStmt;
      uVar12 = sqlite3LockAndPrepare
                         (psVar4,pcVar16,-1,0,(Vdbe *)pStmt,(sqlite3_stmt **)&local_190,(char **)0x0
                         );
      pFromStmt = local_190;
      if (uVar12 == 0) {
        memcpy(local_158,local_190,0x128);
        memcpy(pFromStmt,pStmt,0x128);
        memcpy(pStmt,local_158,0x128);
        pVVar7 = *(Vdbe **)(pStmt + 0x58);
        pVVar8 = pFromStmt->pPrev;
        pVVar9 = pFromStmt->pNext;
        pFromStmt->pPrev = *(Vdbe **)(pStmt + 0x50);
        pFromStmt->pNext = pVVar7;
        *(Vdbe **)(pStmt + 0x50) = pVVar8;
        *(Vdbe **)(pStmt + 0x58) = pVVar9;
        pcVar16 = pFromStmt->zSql;
        pFromStmt->zSql = *(char **)(pStmt + 0xe0);
        *(char **)(pStmt + 0xe0) = pcVar16;
        *(ushort *)(pStmt + 0x8c) =
             (ushort)*(undefined4 *)(pStmt + 0x8c) & 0xfeff |
             *(ushort *)&pFromStmt->field_0x8c & 0x100;
        sqlite3TransferBindings((sqlite3_stmt *)pFromStmt,pStmt);
        local_190->rc = 0;
        sqlite3VdbeFinalize(local_190);
        uVar12 = 0;
      }
      else if (uVar12 == 7) {
        psVar4->mallocFailed = '\x01';
      }
      uVar24 = uVar12;
      if (uVar12 != 0) goto LAB_0011313a;
      sqlite3_reset(pStmt);
      if (-1 < iVar25) {
        pStmt[0x8d] = (sqlite3_stmt)((byte)pStmt[0x8d] | 2);
      }
      iVar11 = iVar11 + 1;
      goto LAB_001125c3;
    }
    uVar24 = 0x11;
LAB_0011313a:
    psVar4 = local_170;
    if (uVar12 != 0) {
      pcVar16 = (char *)sqlite3ValueText(local_170->pErr,'\x01');
      sqlite3DbFree(psVar4,*(void **)(pStmt + 0x48));
      if (psVar4->mallocFailed == '\0') {
        pcVar16 = sqlite3DbStrDup(psVar4,pcVar16);
      }
      else {
        uVar12 = 7;
        pcVar16 = (char *)0x0;
        uVar24 = 7;
      }
      *(char **)(pStmt + 0x48) = pcVar16;
      *(uint *)(pStmt + 0x84) = uVar12;
    }
    if (psVar4 == (sqlite3 *)0x0) {
      uVar24 = uVar24 & 0xff;
    }
    else if ((uVar24 == 0xc0a) || (psVar4->mallocFailed != '\0')) {
      apiOomError(psVar4);
      uVar24 = 7;
    }
    else {
      uVar24 = uVar24 & psVar4->errMask;
    }
    if (psVar4->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar4->mutex);
    }
  }
  else {
    uVar24 = 0x15;
    sqlite3_log(0x15,"misuse at line %d of [%.10s]",0x10f20,
                "8a8ffc862e96f57aa698f93de10dee28e69f6e09");
  }
  return uVar24;
}

Assistant:

SQLITE_STDCALL sqlite3_step(sqlite3_stmt *pStmt){
  int rc = SQLITE_OK;      /* Result from sqlite3Step() */
  int rc2 = SQLITE_OK;     /* Result from sqlite3Reprepare() */
  Vdbe *v = (Vdbe*)pStmt;  /* the prepared statement */
  int cnt = 0;             /* Counter to prevent infinite loop of reprepares */
  sqlite3 *db;             /* The database connection */

  if( vdbeSafetyNotNull(v) ){
    return SQLITE_MISUSE_BKPT;
  }
  db = v->db;
  sqlite3_mutex_enter(db->mutex);
  v->doingRerun = 0;
  while( (rc = sqlite3Step(v))==SQLITE_SCHEMA
         && cnt++ < SQLITE_MAX_SCHEMA_RETRY ){
    int savedPc = v->pc;
    rc2 = rc = sqlite3Reprepare(v);
    if( rc!=SQLITE_OK) break;
    sqlite3_reset(pStmt);
    if( savedPc>=0 ) v->doingRerun = 1;
    assert( v->expired==0 );
  }
  if( rc2!=SQLITE_OK ){
    /* This case occurs after failing to recompile an sql statement. 
    ** The error message from the SQL compiler has already been loaded 
    ** into the database handle. This block copies the error message 
    ** from the database handle into the statement and sets the statement
    ** program counter to 0 to ensure that when the statement is 
    ** finalized or reset the parser error message is available via
    ** sqlite3_errmsg() and sqlite3_errcode().
    */
    const char *zErr = (const char *)sqlite3_value_text(db->pErr); 
    sqlite3DbFree(db, v->zErrMsg);
    if( !db->mallocFailed ){
      v->zErrMsg = sqlite3DbStrDup(db, zErr);
      v->rc = rc2;
    } else {
      v->zErrMsg = 0;
      v->rc = rc = SQLITE_NOMEM;
    }
  }
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}